

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first.c
# Opt level: O1

char * hexdump(uchar *buffer,size_t len)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  
  if (len < 0xc9) {
    if (len == 0) {
      pcVar1 = hexdump::dump;
    }
    else {
      pcVar1 = hexdump::dump;
      sVar2 = 0;
      pcVar3 = hexdump::dump;
      do {
        curl_msnprintf(pcVar3,4,"%02x ",buffer[sVar2]);
        sVar2 = sVar2 + 1;
        pcVar3 = pcVar3 + 3;
      } while (len != sVar2);
    }
  }
  else {
    pcVar1 = (char *)0x0;
  }
  return pcVar1;
}

Assistant:

char *hexdump(unsigned char *buffer, size_t len)
{
  static char dump[200*3+1];
  char *p = dump;
  size_t i;
  if(len > 200)
    return NULL;
  for(i=0; i<len; i++, p += 3)
    snprintf(p, 4, "%02x ", buffer[i]);
  return dump;
}